

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filterednormalizer2.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::FilteredNormalizer2::normalize
          (FilteredNormalizer2 *this,UnicodeString *src,UnicodeString *dest,
          USetSpanCondition spanCondition,UErrorCode *errorCode)

{
  Normalizer2 *pNVar1;
  UBool UVar2;
  int32_t iVar3;
  int iVar4;
  undefined4 extraout_var;
  UnicodeString local_d0;
  int local_8c;
  int32_t local_88;
  int32_t spanLength;
  int32_t spanLimit;
  int local_74;
  undefined1 local_70 [4];
  int32_t prevSpanLimit;
  UnicodeString tempDest;
  UErrorCode *errorCode_local;
  USetSpanCondition spanCondition_local;
  UnicodeString *dest_local;
  UnicodeString *src_local;
  FilteredNormalizer2 *this_local;
  
  tempDest.fUnion._48_8_ = errorCode;
  UnicodeString::UnicodeString((UnicodeString *)local_70);
  local_74 = 0;
  errorCode_local._4_4_ = spanCondition;
  while (iVar4 = local_74, iVar3 = UnicodeString::length(src), iVar4 < iVar3) {
    local_88 = UnicodeSet::span(this->set,src,local_74,errorCode_local._4_4_);
    local_8c = local_88 - local_74;
    if (errorCode_local._4_4_ == USET_SPAN_NOT_CONTAINED) {
      if (local_8c != 0) {
        UnicodeString::append(dest,src,local_74,local_8c);
      }
      errorCode_local._4_4_ = USET_SPAN_SIMPLE;
    }
    else {
      if (local_8c != 0) {
        pNVar1 = this->norm2;
        UnicodeString::tempSubStringBetween(&local_d0,src,local_74,local_88);
        iVar4 = (*(pNVar1->super_UObject)._vptr_UObject[3])
                          (pNVar1,&local_d0,local_70,tempDest.fUnion._48_8_);
        UnicodeString::append(dest,(UnicodeString *)CONCAT44(extraout_var,iVar4));
        UnicodeString::~UnicodeString(&local_d0);
        UVar2 = ::U_FAILURE(*(UErrorCode *)tempDest.fUnion._48_8_);
        if (UVar2 != '\0') break;
      }
      errorCode_local._4_4_ = USET_SPAN_NOT_CONTAINED;
    }
    local_74 = local_88;
  }
  UnicodeString::~UnicodeString((UnicodeString *)local_70);
  return dest;
}

Assistant:

UnicodeString &
FilteredNormalizer2::normalize(const UnicodeString &src,
                               UnicodeString &dest,
                               USetSpanCondition spanCondition,
                               UErrorCode &errorCode) const {
    UnicodeString tempDest;  // Don't throw away destination buffer between iterations.
    for(int32_t prevSpanLimit=0; prevSpanLimit<src.length();) {
        int32_t spanLimit=set.span(src, prevSpanLimit, spanCondition);
        int32_t spanLength=spanLimit-prevSpanLimit;
        if(spanCondition==USET_SPAN_NOT_CONTAINED) {
            if(spanLength!=0) {
                dest.append(src, prevSpanLimit, spanLength);
            }
            spanCondition=USET_SPAN_SIMPLE;
        } else {
            if(spanLength!=0) {
                // Not norm2.normalizeSecondAndAppend() because we do not want
                // to modify the non-filter part of dest.
                dest.append(norm2.normalize(src.tempSubStringBetween(prevSpanLimit, spanLimit),
                                            tempDest, errorCode));
                if(U_FAILURE(errorCode)) {
                    break;
                }
            }
            spanCondition=USET_SPAN_NOT_CONTAINED;
        }
        prevSpanLimit=spanLimit;
    }
    return dest;
}